

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_AllowExtras_Test::~TApp_AllowExtras_Test(TApp_AllowExtras_Test *this)

{
  TApp_AllowExtras_Test *this_local;
  
  ~TApp_AllowExtras_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, AllowExtras) {

    app.allow_extras();

    bool val = true;
    app.add_flag("-f", val);
    EXPECT_FALSE(val);

    args = {"-x", "-f"};

    EXPECT_NO_THROW(run());
    EXPECT_TRUE(val);
    EXPECT_EQ(app.remaining(), std::vector<std::string>({"-x"}));
}